

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O2

void __thiscall
KokkosTools::SpaceTimeStack::Allocations::allocate
          (Allocations *this,string *name,void *ptr,uint64_t size,StackNode *frame)

{
  pair<std::_Rb_tree_iterator<KokkosTools::SpaceTimeStack::Allocation>,_bool> pVar1;
  Allocation AStack_68;
  
  if (ptr == (void *)0x0) {
    if (size != 0) {
      __assert_fail("size == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp"
                    ,0x20d,
                    "void KokkosTools::SpaceTimeStack::Allocations::allocate(std::string &&, const void *, std::uint64_t, StackNode *)"
                   );
    }
  }
  else {
    std::__cxx11::string::string((string *)&AStack_68,(string *)name);
    AStack_68.ptr = ptr;
    AStack_68.size = size;
    AStack_68.frame = frame;
    pVar1 = std::
            _Rb_tree<KokkosTools::SpaceTimeStack::Allocation,_KokkosTools::SpaceTimeStack::Allocation,_std::_Identity<KokkosTools::SpaceTimeStack::Allocation>,_std::less<KokkosTools::SpaceTimeStack::Allocation>,_std::allocator<KokkosTools::SpaceTimeStack::Allocation>_>
            ::_M_emplace_unique<KokkosTools::SpaceTimeStack::Allocation>
                      (&(this->alloc_set)._M_t,&AStack_68);
    std::__cxx11::string::~string((string *)&AStack_68);
    if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("res.second",
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp"
                    ,0x211,
                    "void KokkosTools::SpaceTimeStack::Allocations::allocate(std::string &&, const void *, std::uint64_t, StackNode *)"
                   );
    }
    this->total_size = this->total_size + size;
  }
  return;
}

Assistant:

void allocate(std::string&& name, const void* ptr, std::uint64_t size,
                StackNode* frame) {
    if (ptr == nullptr) {
      assert(size == 0);
      return;
    }
    auto res = alloc_set.emplace(Allocation(std::move(name), ptr, size, frame));
    assert(res.second);
    total_size += size;
  }